

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Stream_Free(FT_Stream stream,FT_Int external)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Int external_local;
  FT_Stream stream_local;
  
  if (stream != (FT_Stream)0x0) {
    memory_00 = stream->memory;
    FT_Stream_Close(stream);
    if (external == 0) {
      ft_mem_free(memory_00,stream);
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Stream_Free( FT_Stream  stream,
                  FT_Int     external )
  {
    if ( stream )
    {
      FT_Memory  memory = stream->memory;


      FT_Stream_Close( stream );

      if ( !external )
        FT_FREE( stream );
    }
  }